

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL>::get
          (SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.isSet == true) {
    puVar3 = *(undefined8 **)&output[1].exception.ptr;
    uVar4 = *(undefined4 *)((long)&pEVar1[1].exception.ptr.field_1 + 0x10);
    uVar5 = *(undefined4 *)((long)&pEVar1[1].exception.ptr.field_1 + 0x14);
    uVar6 = *(undefined4 *)((long)&pEVar1[1].exception.ptr.field_1 + 0x18);
    uVar7 = *(undefined4 *)((long)&pEVar1[1].exception.ptr.field_1 + 0x1c);
    pEVar1[1].exception.ptr.field_1.value.file = (char *)0x0;
    plVar2 = (long *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
  }
  else {
    puVar3 = *(undefined8 **)&output[1].exception.ptr;
    plVar2 = (long *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
  }
  *(undefined4 *)&output[1].exception.ptr = uVar4;
  *(undefined4 *)&output[1].exception.ptr.field_0x4 = uVar5;
  *(undefined4 *)&output[1].exception.ptr.field_1 = uVar6;
  *(undefined4 *)((long)&output[1].exception.ptr.field_1 + 4) = uVar7;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar3)(puVar3,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }